

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<int>,_int>::reallocate
          (ArenaVectorBase<ArenaVector<int>,_int> *this,size_t size)

{
  int *piVar1;
  ulong local_28;
  size_t i;
  int *old;
  size_t size_local;
  ArenaVectorBase<ArenaVector<int>,_int> *this_local;
  
  piVar1 = this->data;
  ArenaVector<int>::allocate((ArenaVector<int> *)this,size);
  for (local_28 = 0; local_28 < this->usedElements; local_28 = local_28 + 1) {
    this->data[local_28] = piVar1[local_28];
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }